

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infcover.c
# Opt level: O1

void * mem_alloc(void *mem,uint count,uint size)

{
  void *__s;
  undefined8 *puVar1;
  size_t __size;
  ulong uVar2;
  
  if (mem != (void *)0x0) {
    __size = (ulong)size * (ulong)count;
    if (((*(ulong *)((long)mem + 0x18) == 0) ||
        (*(long *)((long)mem + 8) + __size <= *(ulong *)((long)mem + 0x18))) &&
       (__s = malloc(__size), __s != (void *)0x0)) {
      memset(__s,0xa5,__size);
      puVar1 = (undefined8 *)malloc(0x18);
      if (puVar1 != (undefined8 *)0x0) {
        *puVar1 = __s;
        puVar1[1] = __size;
        puVar1[2] = *mem;
        *(undefined8 **)mem = puVar1;
        uVar2 = __size + *(long *)((long)mem + 8);
        *(ulong *)((long)mem + 8) = uVar2;
        if (uVar2 <= *(ulong *)((long)mem + 0x10)) {
          return __s;
        }
        *(ulong *)((long)mem + 0x10) = uVar2;
        return __s;
      }
      free(__s);
    }
  }
  return (void *)0x0;
}

Assistant:

static void *mem_alloc(void *mem, unsigned count, unsigned size) {
    void *ptr;
    struct mem_item *item;
    struct mem_zone *zone = mem;
    size_t len = count * (size_t)size;

    /* induced allocation failure */
    if (zone == NULL || (zone->limit && zone->total + len > zone->limit))
        return NULL;

    /* perform allocation using the standard library, fill memory with a
       non-zero value to make sure that the code isn't depending on zeros */
    ptr = malloc(len);
    if (ptr == NULL)
        return NULL;
    memset(ptr, 0xa5, len);

    /* create a new item for the list */
    item = malloc(sizeof(struct mem_item));
    if (item == NULL) {
        free(ptr);
        return NULL;
    }
    item->ptr = ptr;
    item->size = len;

    /* insert item at the beginning of the list */
    item->next = zone->first;
    zone->first = item;

    /* update the statistics */
    zone->total += item->size;
    if (zone->total > zone->highwater)
        zone->highwater = zone->total;

    /* return the allocated memory */
    return ptr;
}